

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int pmbtoken_generate_key(PMBTOKEN_METHOD *method,CBB *out_private,CBB *out_public)

{
  int iVar1;
  EC_SCALAR x1;
  EC_SCALAR y0;
  EC_SCALAR x0;
  EC_SCALAR ys;
  EC_SCALAR xs;
  EC_SCALAR y1;
  
  iVar1 = ec_random_nonzero_scalar(method->group,&x0,"");
  if (((iVar1 != 0) && (iVar1 = ec_random_nonzero_scalar(method->group,&y0,""), iVar1 != 0)) &&
     (iVar1 = ec_random_nonzero_scalar(method->group,&x1,""), iVar1 != 0)) {
    iVar1 = ec_random_nonzero_scalar(method->group,&y1,"");
    if (iVar1 != 0) {
      iVar1 = ec_random_nonzero_scalar(method->group,&xs,"");
      if (iVar1 != 0) {
        iVar1 = ec_random_nonzero_scalar(method->group,&ys,"");
        if (iVar1 != 0) {
          iVar1 = pmbtoken_compute_keys(method,out_private,out_public,&x0,&y0,&x1,&y1,&xs,&ys);
          return iVar1;
        }
      }
    }
  }
  ERR_put_error(0x20,0,100,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/trust_token/pmbtoken.cc"
                ,0xeb);
  return 0;
}

Assistant:

static int pmbtoken_generate_key(const PMBTOKEN_METHOD *method,
                                 CBB *out_private, CBB *out_public) {
  EC_SCALAR x0, y0, x1, y1, xs, ys;
  if (!ec_random_nonzero_scalar(method->group, &x0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &y0, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &x1, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &y1, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &xs, kDefaultAdditionalData) ||
      !ec_random_nonzero_scalar(method->group, &ys, kDefaultAdditionalData)) {
    OPENSSL_PUT_ERROR(TRUST_TOKEN, TRUST_TOKEN_R_KEYGEN_FAILURE);
    return 0;
  }

  return pmbtoken_compute_keys(method, out_private, out_public, &x0, &y0, &x1,
                               &y1, &xs, &ys);
}